

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

Variable resolve_var(Vm *vm,char *name,size_t length)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  undefined3 uVar6;
  long lVar7;
  Variable VVar8;
  char *err_message;
  size_t sVar9;
  ulong uVar10;
  Compiler *compiler;
  undefined8 uStack_60;
  char acStack_58 [8];
  char *local_50;
  undefined1 *local_48;
  unsigned_long __vla_expr0;
  Variable *local_38;
  Variable *variable;
  size_t length_local;
  char *name_local;
  Vm *vm_local;
  Variable error;
  undefined4 uVar5;
  
  uStack_60 = 0x1086c5;
  variable = (Variable *)length;
  length_local = (size_t)name;
  name_local = (char *)vm;
  local_38 = resolve_name(vm,name,length);
  sVar9 = length_local;
  if (local_38 == (Variable *)0x0) {
    local_48 = (undefined1 *)((long)&variable[2].index + 2);
    lVar7 = -((ulong)((long)&variable[3].index + 1U) & 0xfffffffffffffff0);
    uVar10 = (ulong)variable & 0xffffffff;
    local_50 = acStack_58 + lVar7;
    __vla_expr0 = (unsigned_long)acStack_58;
    *(undefined8 *)((long)&uStack_60 + lVar7) = 0x108728;
    sprintf(acStack_58 + lVar7,"Could not find variable with name %.*s",uVar10,sVar9);
    err_message = local_50;
    compiler = (Compiler *)(name_local + 0x1020);
    *(undefined8 *)((long)&uStack_60 + lVar7) = 0x10873c;
    ::error(compiler,err_message);
    vm_local._0_4_ = 0xffffffff;
    error.index = -1;
  }
  else {
    uVar1 = local_38->index;
    uVar4 = local_38->scope;
    uVar2 = local_38->frame_offset;
    uVar3 = local_38->assignable;
    uVar6 = *(undefined3 *)&local_38->field_0xd;
    uVar5 = CONCAT31(uVar6,uVar3);
    vm_local._0_4_ = uVar1;
    vm_local._4_4_ = uVar4;
    error.index = uVar2;
    error.scope = uVar5;
  }
  VVar8.scope = vm_local._4_4_;
  VVar8.index = vm_local._0_4_;
  VVar8.frame_offset = error.index;
  VVar8._12_4_ = error.scope;
  return VVar8;
}

Assistant:

static Variable resolve_var(Vm *vm, const char *name, size_t length) {
    Variable *variable = resolve_name(vm, name, length);

    if (variable != NULL) { return *variable; }

    char message[34 + length];
    sprintf(message, "Could not find variable with name %.*s", (int) length, name);
    error(&vm->compiler, message);

    // not reachable, but clang warnings are annoying
    Variable error;
    error.index = -1;
    error.frame_offset = -1;
    return error;
}